

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O2

ROMInfo ** MT32Emu::ROMInfo::getFullROMInfos(Bit32u *itemCount)

{
  if (itemCount != (Bit32u *)0x0) {
    getROMInfoLists();
    *itemCount = 0xe;
  }
  getROMInfoLists();
  return getROMInfoLists::FULL_ROM_INFOS;
}

Assistant:

const ROMInfo * const *ROMInfo::getFullROMInfos(Bit32u *itemCount) {
	if (itemCount != NULL) *itemCount = getROMInfoLists().fullROMInfos.itemCount;
	return getROMInfoLists().fullROMInfos.romInfos;
}